

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::extractBits(APInt *this,uint numBits,uint bitPosition)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  uint64_t *__dest;
  uint in_ECX;
  int iVar4;
  anon_union_8_2_1313ab2f_for_U extraout_RDX;
  anon_union_8_2_1313ab2f_for_U extraout_RDX_01;
  anon_union_8_2_1313ab2f_for_U extraout_RDX_02;
  uint uVar5;
  undefined4 in_register_00000034;
  ulong *puVar6;
  ulong uVar7;
  anon_union_8_2_1313ab2f_for_U aVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ArrayRef<unsigned_long> bigVal;
  APInt AVar13;
  APInt Result;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  anon_union_8_2_1313ab2f_for_U extraout_RDX_00;
  
  puVar6 = (ulong *)CONCAT44(in_register_00000034,numBits);
  if (bitPosition == 0) {
    __assert_fail("numBits > 0 && \"Can\'t extract zero bits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x194,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  uVar5 = (uint)puVar6[1];
  if ((uVar5 <= in_ECX) || (uVar5 < in_ECX + bitPosition)) {
    __assert_fail("bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth && \"Illegal bit extraction\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x196,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  if (uVar5 < 0x41) {
    uVar3 = *puVar6;
    uVar5 = in_ECX;
  }
  else {
    uVar5 = in_ECX & 0x3f;
    uVar11 = in_ECX >> 6;
    iVar4 = ((in_ECX + bitPosition) - 1 >> 6) - uVar11;
    if (iVar4 != 0) {
      if (uVar5 == 0) {
        bigVal.Length._0_4_ = iVar4 + 1;
        bigVal.Data = (unsigned_long *)((ulong)(uVar11 << 3) + *puVar6);
        bigVal.Length._4_4_ = 0;
        APInt(this,bitPosition,bigVal);
        aVar8 = extraout_RDX_00;
      }
      else {
        APInt((APInt *)&local_40,bitPosition,0,false);
        uVar1 = local_38;
        uVar3 = (ulong)local_38;
        uVar7 = uVar3 + 0x3f >> 6;
        aVar8 = local_40;
        if (uVar3 < 0x41) {
          aVar8.pVal = (uint64_t *)&local_40;
        }
        if (uVar3 != 0) {
          uVar3 = puVar6[1];
          uVar9 = (ulong)uVar11;
          uVar10 = uVar7;
          do {
            uVar9 = uVar9 + 1;
            if (uVar9 < (ulong)(uint)uVar3 + 0x3f >> 6) {
              lVar12 = *(long *)(*puVar6 + uVar9 * 8);
            }
            else {
              lVar12 = 0;
            }
            *aVar8.pVal = lVar12 << (0x40U - (sbyte)uVar5 & 0x3f) |
                          *(ulong *)((*puVar6 - 8) + uVar9 * 8) >> (sbyte)uVar5;
            aVar8.pVal = (uint64_t *)(aVar8.VAL + 8);
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        aVar8.pVal = local_40.pVal + ((int)uVar7 - 1);
        if (uVar1 < 0x41) {
          aVar8.pVal = (uint64_t *)&local_40;
        }
        bVar2 = -(char)uVar1;
        *aVar8.pVal = (*aVar8.pVal << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
        this->BitWidth = local_38;
        if ((ulong)local_38 < 0x41) {
          (this->U).pVal = (uint64_t *)local_40;
        }
        else {
          uVar3 = (ulong)((uint)((ulong)local_38 + 0x3f >> 3) & 0xfffffff8);
          __dest = (uint64_t *)operator_new__(uVar3);
          (this->U).pVal = __dest;
          memcpy(__dest,local_40.pVal,uVar3);
          aVar8 = extraout_RDX_01;
          if ((anon_union_8_2_1313ab2f_for_U *)local_40.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)
          {
            operator_delete__(local_40.pVal);
            aVar8 = extraout_RDX_02;
          }
        }
      }
      goto LAB_001984bf;
    }
    uVar3 = *(ulong *)(*puVar6 + (ulong)uVar11 * 8);
  }
  APInt(this,bitPosition,uVar3 >> ((byte)uVar5 & 0x3f),false);
  aVar8 = extraout_RDX;
LAB_001984bf:
  AVar13._8_8_ = aVar8.VAL;
  AVar13.U.pVal = (uint64_t *)this;
  return AVar13;
}

Assistant:

APInt APInt::extractBits(unsigned numBits, unsigned bitPosition) const {
  assert(numBits > 0 && "Can't extract zero bits");
  assert(bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth &&
         "Illegal bit extraction");

  if (isSingleWord())
    return APInt(numBits, U.VAL >> bitPosition);

  unsigned loBit = whichBit(bitPosition);
  unsigned loWord = whichWord(bitPosition);
  unsigned hiWord = whichWord(bitPosition + numBits - 1);

  // Single word result extracting bits from a single word source.
  if (loWord == hiWord)
    return APInt(numBits, U.pVal[loWord] >> loBit);

  // Extracting bits that start on a source word boundary can be done
  // as a fast memory copy.
  if (loBit == 0)
    return APInt(numBits, makeArrayRef(U.pVal + loWord, 1 + hiWord - loWord));

  // General case - shift + copy source words directly into place.
  APInt Result(numBits, 0);
  unsigned NumSrcWords = getNumWords();
  unsigned NumDstWords = Result.getNumWords();

  uint64_t *DestPtr = Result.isSingleWord() ? &Result.U.VAL : Result.U.pVal;
  for (unsigned word = 0; word < NumDstWords; ++word) {
    uint64_t w0 = U.pVal[loWord + word];
    uint64_t w1 =
        (loWord + word + 1) < NumSrcWords ? U.pVal[loWord + word + 1] : 0;
    DestPtr[word] = (w0 >> loBit) | (w1 << (APINT_BITS_PER_WORD - loBit));
  }

  return Result.clearUnusedBits();
}